

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

Resource res_getTableItemByKey_63(ResourceData *pResData,Resource table,int32_t *indexR,char **key)

{
  ushort *puVar1;
  uint *puVar2;
  ushort uVar3;
  char *key_00;
  int32_t *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t *piVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  if (key == (char **)0x0) {
    return 0xffffffff;
  }
  key_00 = *key;
  if (key_00 == (char *)0x0) {
    return 0xffffffff;
  }
  uVar5 = table & 0xfffffff;
  uVar11 = table >> 0x1c;
  if (uVar11 == 5) {
    puVar1 = pResData->p16BitUnits + uVar5;
    uVar3 = *puVar1;
    uVar11 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar3,key_00,key);
    *indexR = uVar11;
    uVar5 = uVar11;
    if (-1 < (int)uVar11) {
      uVar3 = (puVar1 + 1)[uVar3 + uVar11];
      uVar5 = (uint)uVar3;
      if (pResData->poolStringIndex16Limit <= (int)(uint)uVar3) {
        uVar5 = ((uint)uVar3 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
      }
      uVar5 = uVar5 | 0x60000000;
    }
  }
  else {
    if (uVar11 == 4) {
      if (uVar5 == 0) {
        return 0xffffffff;
      }
      piVar4 = pResData->pRoot;
      puVar2 = (uint *)(piVar4 + uVar5);
      uVar5 = *puVar2;
      if ((int)uVar5 < 1) {
        uVar11 = 0xffffffff;
      }
      else {
        iVar9 = 0;
        uVar10 = uVar5;
        do {
          uVar11 = iVar9 + uVar10 >> 1;
          uVar6 = puVar2[(ulong)uVar11 + 1];
          piVar8 = piVar4;
          if ((int)uVar6 < 0) {
            uVar6 = uVar6 & 0x7fffffff;
            piVar8 = (int32_t *)pResData->poolBundleKeys;
          }
          iVar7 = strcmp(key_00,(char *)((ulong)uVar6 + (long)piVar8));
          if (-1 < iVar7) {
            if (iVar7 == 0) {
              *key = (char *)((ulong)uVar6 + (long)piVar8);
              goto LAB_002f8a8b;
            }
            iVar9 = uVar11 + 1;
            uVar11 = uVar10;
          }
          uVar10 = uVar11;
        } while (iVar9 < (int)uVar10);
        uVar11 = 0xffffffff;
      }
LAB_002f8a8b:
      *indexR = uVar11;
      if ((int)uVar11 < 0) {
        return 0xffffffff;
      }
      return puVar2[(long)(int)(uVar5 + uVar11) + 1];
    }
    if (uVar11 != 2) {
      return 0xffffffff;
    }
    if (uVar5 == 0) {
      return 0xffffffff;
    }
    puVar1 = (ushort *)(pResData->pRoot + uVar5);
    uVar3 = *puVar1;
    uVar11 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar3,key_00,key);
    *indexR = uVar11;
    uVar5 = uVar11;
    if (-1 < (int)uVar11) {
      uVar5 = *(uint *)(puVar1 + 1 + (ulong)uVar3 + (ulong)(~(uint)uVar3 & 1) + (ulong)uVar11 * 2);
    }
  }
  if ((int)uVar11 < 0) {
    return 0xffffffff;
  }
  return uVar5;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByKey(const ResourceData *pResData, Resource table,
                      int32_t *indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    int32_t idx;
    if(key == NULL || *key == NULL) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset!=0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
            if(idx>=0) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                return p32[idx];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
        if(idx>=0) {
            return makeResourceFrom16(pResData, p[length+idx]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            *indexR=idx=_res_findTable32Item(pResData, p, length, *key, key);
            if(idx>=0) {
                return (Resource)p[length+idx];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}